

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcConstructionResource::IfcConstructionResource
          (IfcConstructionResource *this)

{
  *(undefined ***)&this->field_0x178 = &PTR__Object_007e6a70;
  *(undefined8 *)&this->field_0x180 = 0;
  *(char **)&this->field_0x188 = "IfcConstructionResource";
  IfcResource::IfcResource((IfcResource *)this,&PTR_construction_vtable_24__007fb830);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x7fb750;
  *(undefined8 *)&this->field_0x178 = 0x7fb818;
  *(undefined8 *)&this->field_0x88 = 0x7fb778;
  *(undefined8 *)&this->field_0x98 = 0x7fb7a0;
  *(undefined8 *)&this->field_0xd0 = 0x7fb7c8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).
  _vptr_ObjectHelper = (_func_int **)0x7fb7f0;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).field_0x20
  ;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).field_0x18 = 0
  ;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).field_0x20 = 0;
  this->field_0x110 = 0;
  (this->ResourceGroup).ptr._M_dataplus._M_p = (pointer)&(this->ResourceGroup).ptr.field_2;
  (this->ResourceGroup).ptr._M_string_length = 0;
  (this->ResourceGroup).ptr.field_2._M_local_buf[0] = '\0';
  (this->ResourceGroup).have = false;
  (this->ResourceConsumption).ptr._M_dataplus._M_p =
       (pointer)&(this->ResourceConsumption).ptr.field_2;
  (this->ResourceConsumption).ptr._M_string_length = 0;
  (this->ResourceConsumption).ptr.field_2._M_local_buf[0] = '\0';
  (this->ResourceConsumption).have = false;
  (this->BaseQuantity).ptr.obj = (LazyObject *)0x0;
  (this->BaseQuantity).have = false;
  return;
}

Assistant:

IfcConstructionResource() : Object("IfcConstructionResource") {}